

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  thread thread;
  long local_20;
  long *local_18;
  
  puVar1 = (undefined8 *)operator_new(8);
  puts("Waiting for event.");
  *puVar1 = 1;
  local_20 = 0;
  local_18 = (long *)operator_new(0x10);
  *local_18 = (long)&PTR___State_impl_00103d80;
  local_18[1] = (long)puVar1;
  std::thread::_M_start_thread(&local_20,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  std::thread::join();
  if (local_20 == 0) {
    return 0;
  }
  std::terminate();
}

Assistant:

int main()
{
    auto coro = std::make_unique<PauseResume::scoro>();
    coro->Poll();
    // simulate async event
    // This could be finished by an interrupt or scheduler, timer, IOCP etc...
    std::thread thread
    {
        [](decltype(coro) continue_after_event)
        {
            std::string input;
            std::getline(std::cin, input);
            if (input.compare("x") == 0)
            {
                continue_after_event->Poll();
            }
        },
        std::move(coro)
    };

    thread.join();
}